

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_enum.h
# Opt level: O0

t_enum_value * __thiscall t_enum::get_min_value(t_enum *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pptVar4;
  reference pptVar5;
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_40;
  t_enum_value **local_38;
  int local_2c;
  t_enum_value *ptStack_28;
  int min_value_value;
  t_enum_value *min_value;
  const_iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *enum_values;
  t_enum *this_local;
  
  c_iter._M_current = (t_enum_value **)get_constants(this);
  __gnu_cxx::
  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator((__normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                       *)&min_value);
  sVar3 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::size
                    ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)c_iter._M_current);
  if (sVar3 == 0) {
    ptStack_28 = (t_enum_value *)0x0;
  }
  else {
    pptVar4 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::front
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)
                         c_iter._M_current);
    ptStack_28 = *pptVar4;
    local_2c = t_enum_value::get_value(ptStack_28);
    local_38 = (t_enum_value **)
               std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                         (c_iter._M_current);
    min_value = (t_enum_value *)local_38;
    while( true ) {
      local_40._M_current =
           (t_enum_value **)
           std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end(c_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                          *)&min_value,&local_40);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                ::operator*((__normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                             *)&min_value);
      iVar2 = t_enum_value::get_value(*pptVar5);
      if (iVar2 < local_2c) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                  ::operator*((__normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                               *)&min_value);
        ptStack_28 = *pptVar5;
        local_2c = t_enum_value::get_value(ptStack_28);
      }
      __gnu_cxx::
      __normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
      ::operator++((__normal_iterator<t_enum_value_*const_*,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                    *)&min_value);
    }
  }
  return ptStack_28;
}

Assistant:

t_enum_value* get_min_value() const {
    const std::vector<t_enum_value*>& enum_values = get_constants();
    std::vector<t_enum_value*>::const_iterator c_iter;
    t_enum_value* min_value;
    if (enum_values.size() == 0) {
      min_value = nullptr;
    } else {
      int min_value_value;
      min_value = enum_values.front();
      min_value_value = min_value->get_value();
      for (c_iter = enum_values.begin(); c_iter != enum_values.end(); ++c_iter) {
        if ((*c_iter)->get_value() < min_value_value) {
          min_value = (*c_iter);
          min_value_value = min_value->get_value();
        }
      }
    }
    return min_value;
  }